

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_leaf(lyout *out,int level,lys_node *node)

{
  lys_node *__s1;
  ly_ctx *ctx;
  int level_00;
  int iVar1;
  char *pcVar2;
  lys_module *plVar3;
  char *pcVar4;
  lys_node *local_38;
  char *dflt;
  lys_node_leaf *leaf;
  int i;
  lys_node *node_local;
  int level_local;
  lyout *out_local;
  
  yin_print_open(out,level,(char *)0x0,"leaf","name",node->name,1);
  level_00 = level + 1;
  yin_print_snode_common(out,level_00,node,node->module,(int *)0x0,1);
  if (node[1].name != (char *)0x0) {
    yin_print_when(out,level_00,node->module,(lys_when *)node[1].name);
  }
  for (leaf._4_4_ = 0; leaf._4_4_ < (int)(uint)node->iffeature_size; leaf._4_4_ = leaf._4_4_ + 1) {
    yin_print_iffeature(out,level_00,node->module,node->iffeature + leaf._4_4_);
  }
  yin_print_type(out,level_00,node->module,(lys_type *)&node[1].ref);
  yin_print_substmt(out,level_00,LYEXT_SUBSTMT_UNITS,'\0',(char *)node[1].next,node->module,
                    node->ext,(uint)node->ext_size);
  for (leaf._4_4_ = 0; leaf._4_4_ < (int)(uint)node->padding[3]; leaf._4_4_ = leaf._4_4_ + 1) {
    yin_print_must(out,level_00,node->module,(lys_restr *)(node[1].dsc + (long)leaf._4_4_ * 0x38));
  }
  if (node[1].prev != (lys_node *)0x0) {
    if ((node->flags & 0x800) == 0) {
      local_38 = node[1].prev;
    }
    else {
      pcVar2 = strchr((char *)node[1].prev,0x3a);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("strchr(leaf->dflt, \':\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yin.c"
                      ,0x44e,"void yin_print_leaf(struct lyout *, int, const struct lys_node *)");
      }
      __s1 = node[1].prev;
      plVar3 = lys_node_module(node);
      pcVar2 = plVar3->name;
      pcVar4 = strchr((char *)node[1].prev,0x3a);
      iVar1 = strncmp((char *)__s1,pcVar2,(long)pcVar4 - (long)node[1].prev);
      if (iVar1 == 0) {
        ctx = node->module->ctx;
        pcVar2 = strchr((char *)node[1].prev,0x3a);
        local_38 = (lys_node *)lydict_insert(ctx,pcVar2 + 1,0);
      }
      else {
        local_38 = (lys_node *)transform_json2schema(node->module,(char *)node[1].prev);
      }
    }
    yin_print_substmt(out,level_00,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)local_38,node->module,
                      node->ext,(uint)node->ext_size);
    if ((node->flags & 0x800) != 0) {
      lydict_remove(node->module->ctx,(char *)local_38);
    }
  }
  yin_print_snode_common(out,level_00,node,node->module,(int *)0x0,0x7c);
  yin_print_close(out,level,(char *)0x0,"leaf",1);
  return;
}

Assistant:

static void
yin_print_leaf(struct lyout *out, int level, const struct lys_node *node)
{
    int i;
    struct lys_node_leaf *leaf = (struct lys_node_leaf *)node;
    const char *dflt;

    yin_print_open(out, level, NULL, "leaf", "name", node->name, 1);
    level++;

    yin_print_snode_common(out, level, node, node->module, NULL, SNODE_COMMON_EXT);
    if (leaf->when) {
        yin_print_when(out, level, node->module, leaf->when);
    }
    for (i = 0; i < leaf->iffeature_size; i++) {
        yin_print_iffeature(out, level, node->module, &leaf->iffeature[i]);
    }
    yin_print_type(out, level, node->module, &leaf->type);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_UNITS, 0, leaf->units,
                      node->module, node->ext, node->ext_size);
    for (i = 0; i < leaf->must_size; i++) {
        yin_print_must(out, level, node->module, &leaf->must[i]);
    }
    if (leaf->dflt) {
        if (leaf->flags & LYS_DFLTJSON) {
            assert(strchr(leaf->dflt, ':'));
            if (!strncmp(leaf->dflt, lys_node_module(node)->name, strchr(leaf->dflt, ':') - leaf->dflt)) {
                /* local module */
                dflt = lydict_insert(node->module->ctx, strchr(leaf->dflt, ':') + 1, 0);
            } else {
                dflt = transform_json2schema(node->module, leaf->dflt);
            }
        } else {
            dflt = leaf->dflt;
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, 0, dflt,
                          node->module, node->ext, node->ext_size);
        if (leaf->flags & LYS_DFLTJSON) {
            lydict_remove(node->module->ctx, dflt);
        }
    }
    yin_print_snode_common(out, level, node, node->module, NULL, SNODE_COMMON_CONFIG | SNODE_COMMON_MAND |
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    yin_print_close(out, level, NULL, "leaf", 1);
}